

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O3

void __thiscall HdmiCecAnalyzerResults::GenStartSeqBubble(HdmiCecAnalyzerResults *this)

{
  char *local_30 [2];
  char local_20 [16];
  
  if (this->mTabular == false) {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"S","");
    AnalyzerResults::AddResultString
              ((char *)this,local_30[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Start","");
    AnalyzerResults::AddResultString
              ((char *)this,local_30[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Start Seq.","");
    AnalyzerResults::AddResultString
              ((char *)this,local_30[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Start Sequence","");
  AnalyzerResults::AddResultString
            ((char *)this,local_30[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenStartSeqBubble()
{
    if( !mTabular )
    {
        AddResult( "S" );
        AddResult( "Start" );
        AddResult( "Start Seq." );
    }
    AddResult( "Start Sequence" );
}